

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O1

string_type * __thiscall
booster::locale::impl_std::std_converter<wchar_t>::convert_abi_cxx11_
          (string_type *__return_storage_ptr__,std_converter<wchar_t> *this,conversion_type how,
          char_type_conflict *begin,char_type_conflict *end,int param_4)

{
  pointer pwVar1;
  ctype *pcVar2;
  size_t __n;
  vector<wchar_t,_std::allocator<wchar_t>_> res;
  allocator_type local_4d;
  value_type_conflict1 local_4c;
  vector<wchar_t,_std::allocator<wchar_t>_> local_48;
  
  if (how - upper_case < 3) {
    pcVar2 = std::use_facet<std::ctype<wchar_t>>(&this->base_);
    local_4c = 0;
    std::vector<wchar_t,_std::allocator<wchar_t>_>::vector
              (&local_48,((long)end - (long)begin >> 2) + 1,&local_4c,&local_4d);
    pwVar1 = local_48.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    __n = (long)end - (long)begin;
    if (__n != 0) {
      memmove(local_48.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
              super__Vector_impl_data._M_start,begin,__n);
    }
    (**(code **)((ulong)(how != upper_case) * 0x10 + 0x38 + *(long *)pcVar2))
              (pcVar2,pwVar1,__n + (long)pwVar1);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)__return_storage_ptr__,pwVar1,__n + (long)pwVar1);
    if (local_48.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)__return_storage_ptr__,begin,end)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual string_type convert(converter_base::conversion_type how,char_type const *begin,char_type const *end,int /*flags*/ = 0) const 
    {
        switch(how) {
        case converter_base::upper_case:
        case converter_base::lower_case:
        case converter_base::case_folding:
            {
                ctype_type const &ct=std::use_facet<ctype_type>(base_);
                size_t len = end - begin;
                std::vector<char_type> res(len+1,0);
                char_type *lbegin = &res[0];
                std::copy(begin,end,lbegin);
                if(how == converter_base::upper_case)
                    ct.toupper(lbegin,lbegin+len);
                else
                    ct.tolower(lbegin,lbegin+len);
                return string_type(lbegin,len);
            }
        default:
            return string_type(begin,end-begin);
        }
    }